

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseFilter::TestCaseFilter(TestCaseFilter *this,string *testSpec,DoWhat matchBehaviour)

{
  bool bVar1;
  char *pcVar2;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [39];
  allocator<char> local_99;
  string local_98;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  DoWhat local_1c;
  string *psStack_18;
  DoWhat matchBehaviour_local;
  string *testSpec_local;
  TestCaseFilter *this_local;
  
  local_1c = matchBehaviour;
  psStack_18 = testSpec;
  testSpec_local = &this->m_stringToMatch;
  std::__cxx11::string::string((string *)this,(string *)testSpec);
  this->m_filterType = local_1c;
  this->m_wildcardPosition = NoWildcard;
  if (this->m_filterType == AutoDetectBehaviour) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"exclude:",&local_41);
    bVar1 = startsWith(&this->m_stringToMatch,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_78,(ulong)this);
      std::__cxx11::string::operator=((string *)this,local_78);
      std::__cxx11::string::~string(local_78);
      this->m_filterType = ExcludeTests;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"~",&local_99);
      bVar1 = startsWith(&this->m_stringToMatch,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_c0,(ulong)this);
        std::__cxx11::string::operator=((string *)this,local_c0);
        std::__cxx11::string::~string(local_c0);
        this->m_filterType = ExcludeTests;
      }
      else {
        this->m_filterType = IncludeTests;
      }
    }
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
  if (*pcVar2 == '*') {
    std::__cxx11::string::substr((ulong)local_e0,(ulong)this);
    std::__cxx11::string::operator=((string *)this,local_e0);
    std::__cxx11::string::~string(local_e0);
    this->m_wildcardPosition = this->m_wildcardPosition | WildcardAtStart;
  }
  std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
  if (*pcVar2 == '*') {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_100,(ulong)this);
    std::__cxx11::string::operator=((string *)this,local_100);
    std::__cxx11::string::~string(local_100);
    this->m_wildcardPosition = this->m_wildcardPosition | WildcardAtEnd;
  }
  return;
}

Assistant:

TestCaseFilter( const std::string& testSpec, IfFilterMatches::DoWhat matchBehaviour = IfFilterMatches::AutoDetectBehaviour )
        :   m_stringToMatch( testSpec ),
            m_filterType( matchBehaviour ),
            m_wildcardPosition( NoWildcard )
        {
            if( m_filterType == IfFilterMatches::AutoDetectBehaviour ) {
                if( startsWith( m_stringToMatch, "exclude:" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 8 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else if( startsWith( m_stringToMatch, "~" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 1 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else {
                    m_filterType = IfFilterMatches::IncludeTests;
                }
            }

            if( m_stringToMatch[0] == '*' ) {
                m_stringToMatch = m_stringToMatch.substr( 1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtStart );
            }
            if( m_stringToMatch[m_stringToMatch.size()-1] == '*' ) {
                m_stringToMatch = m_stringToMatch.substr( 0, m_stringToMatch.size()-1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtEnd );
            }
        }